

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
App::renderTextures_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,App *this,Glyphs *glyphs,Config *config,Font *font,
          vector<Config::Size,_std::allocator<Config::Size>_> *pages)

{
  byte bVar1;
  byte bVar2;
  Library *pLVar3;
  size_t sVar4;
  _Rb_tree_node_base *p_Var5;
  ostream *poVar6;
  pointer puVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  vector<unsigned_int,_std::allocator<unsigned_int>_> surface;
  __string_type fileName;
  string local_1f8;
  string local_1d8;
  stringstream ss;
  ostream local_1a8 [376];
  
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_278.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar8 = __return_storage_ptr__;
  if ((FT_Face_conflict)font->library != font->face) {
    sVar4 = getNumberLen((int)((ulong)((long)font->face - (long)font->library) >> 3) - 1);
    uVar12 = 0;
    while( true ) {
      uVar13 = (ulong)uVar12;
      pLVar3 = font->library;
      if ((ulong)((long)font->face - (long)pLVar3 >> 3) <= uVar13) break;
      _ss = (uint)*(uint3 *)&glyphs[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&surface,(ulong)(uint)(*(int *)((long)&pLVar3[uVar13].library + 4) *
                                       *(int *)&pLVar3[uVar13].library),(value_type_conflict *)&ss,
                 (allocator_type *)&fileName);
      for (p_Var5 = *(_Rb_tree_node_base **)(this + 0x18);
          p_Var5 != (_Rb_tree_node_base *)(this + 8);
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
        if (((*(uint *)&p_Var5[1].field_0x4 == uVar12) && (*(int *)&p_Var5[1]._M_left != 0)) &&
           (*(int *)((long)&p_Var5[1]._M_left + 4) != 0)) {
          ft::Font::renderGlyph
                    ((GlyphMetrics *)&ss,(Font *)config,
                     surface.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                     .super__Vector_impl_data._M_start,*(uint32_t *)&pLVar3[uVar13].library,
                     *(uint32_t *)((long)&pLVar3[uVar13].library + 4),
                     glyphs[2]._M_t._M_impl.super__Rb_tree_header._M_header._M_color +
                     *(int *)&p_Var5[1]._M_parent,
                     *(int *)((long)&glyphs[1]._M_t._M_impl.super__Rb_tree_header._M_node_count + 4)
                     + *(int *)((long)&p_Var5[1]._M_parent + 4),p_Var5[1]._M_color,
                     (uint)*(uint3 *)&glyphs[1]._M_t._M_impl.super__Rb_tree_header._M_header.
                                      _M_right);
        }
      }
      if (*(char *)((long)&glyphs[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_right + 6) ==
          '\0') {
        bVar1 = *(byte *)((long)&glyphs[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_right + 2
                         );
        bVar2 = *(byte *)((long)&glyphs[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_right + 5
                         );
        uVar10 = (uint)*(ushort *)
                        ((long)&glyphs[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_right + 3)
        ;
        uVar9 = (uint)*(ushort *)&glyphs[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
        for (puVar7 = surface.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            puVar7 <= surface.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish + -1; puVar7 = puVar7 + 1) {
          uVar11 = *puVar7 >> 0x18;
          *puVar7 = (uVar11 * (uVar9 & 0xff00) | (0x100 - uVar11) * (uVar10 & 0xff00)) >> 8 & 0xff00
                    | (uVar11 * (uVar9 & 0xff | (uint)bVar1 << 0x10) |
                      (0x100 - uVar11) * (uVar10 & 0xff | (uint)bVar2 << 0x10)) >> 8 & 0xff00ff;
        }
      }
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      std::operator<<(local_1a8,(string *)&glyphs[3]._M_t._M_impl.super__Rb_tree_header);
      if (*(int *)&glyphs[4]._M_t._M_impl.super__Rb_tree_header._M_header.field_0x4 != 2) {
        std::operator<<(local_1a8,"_");
        if (*(int *)&glyphs[4]._M_t._M_impl.super__Rb_tree_header._M_header.field_0x4 == 0) {
          poVar6 = std::operator<<(local_1a8,0x30);
          *(long *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = (long)(int)sVar4;
        }
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      }
      std::operator<<(local_1a8,".png");
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::string((string *)&local_1f8,(string *)&fileName);
      extractFileName(&local_1d8,&local_1f8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_278,
                 &local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_1f8);
      savePng(&fileName,
              surface.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start,*(uint32_t *)&pLVar3[uVar13].library,
              *(uint32_t *)((long)&pLVar3[uVar13].library + 4),
              *(bool *)((long)&glyphs[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_right + 6))
      ;
      std::__cxx11::string::~string((string *)&fileName);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&surface.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      uVar12 = uVar12 + 1;
    }
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start =
         local_278.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish =
         local_278.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_278.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pvVar8 = &local_278;
  }
  (pvVar8->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar8->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar8->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_278);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> App::renderTextures(const Glyphs& glyphs, const Config& config, const ft::Font& font, const std::vector<Config::Size>& pages)
{
    std::vector<std::string> fileNames;
    if (pages.empty())
        return {};

    const auto pageNameDigits = getNumberLen(pages.size() - 1);

    for (std::uint32_t page = 0; page < pages.size(); ++page)
    {
        const Config::Size& s = pages[page];
        std::vector<std::uint32_t> surface(s.w * s.h, config.color.getBGR());

        // Render every glyph
        //TODO: do not repeat same glyphs (with same index)
        for (const auto& kv: glyphs)
        {
            const auto& glyph = kv.second;
            if (glyph.page != page)
                continue;

            if (!glyph.isEmpty())
            {
                const auto x = glyph.x + config.padding.left;
                const auto y = glyph.y + config.padding.up;

                font.renderGlyph(&surface[0], s.w, s.h, x, y,
                        kv.first, config.color.getBGR());
            }
        }

        if (!config.backgroundTransparent)
        {
            auto cur = surface.data();
            const auto end = &surface.back();

            const auto fgColor = config.color.getBGR();
            const auto bgColor = config.backgroundColor.getBGR();

            while (cur <= end)
            {
                const std::uint32_t a0 = (*cur) >> 24u;
                const std::uint32_t a1 = 256 - a0;
                const std::uint32_t rb1 = (a1 * (bgColor & 0xFF00FFu)) >> 8u;
                const std::uint32_t rb2 = (a0 * (fgColor & 0xFF00FFu)) >> 8u;
                const std::uint32_t g1  = (a1 * (bgColor & 0x00FF00u)) >> 8u;
                const std::uint32_t g2  = (a0 * (fgColor & 0x00FF00u)) >> 8u;
                *cur =  ((rb1 | rb2) & 0xFF00FFu) + ((g1 | g2) & 0x00FF00u);
                ++cur;
            }
        }

        std::stringstream ss;
        ss << config.output;
        if (config.textureNameSuffix != Config::TextureNameSuffix::None)
        {
            ss << "_";
            if (config.textureNameSuffix == Config::TextureNameSuffix::IndexAligned)
                ss << std::setfill ('0') << std::setw(pageNameDigits);
            ss << page;
        }
        ss << ".png";
        const auto fileName = ss.str();
        fileNames.push_back(extractFileName(fileName));

        savePng(fileName, &surface[0], s.w, s.h, config.backgroundTransparent);
    }

    return fileNames;
}